

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O3

int run_test_random_sync(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *loop;
  char buf [256];
  char zero [256];
  
  loop = (uv_loop_t *)&stack0xfffffffffffffdf8;
  puVar2 = (uv_loop_t *)0x0;
  iVar1 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,&stack0xfffffffffffffdf8,0x100,0xffffffff,
                    (uv_random_cb)0x0);
  if (iVar1 == -0x16) {
    puVar2 = (uv_loop_t *)0x0;
    iVar1 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,&stack0xfffffffffffffdf8,
                      0xffffffffffffffff,0xffffffff,(uv_random_cb)0x0);
    if (iVar1 != -7) goto LAB_00166611;
    memset(&stack0xfffffffffffffdf8,0,0x100);
    puVar2 = (uv_loop_t *)0x0;
    iVar1 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,&stack0xfffffffffffffdf8,0x100,0,
                      (uv_random_cb)0x0);
    if (iVar1 != 0) goto LAB_00166616;
    memset(&stack0xfffffffffffffef8,0,0x100);
    iVar1 = bcmp(&stack0xfffffffffffffdf8,&stack0xfffffffffffffef8,0x100);
    if (iVar1 != 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = uv_default_loop();
      iVar1 = uv_loop_close(loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00166620;
    }
  }
  else {
    run_test_random_sync_cold_1();
LAB_00166611:
    run_test_random_sync_cold_2();
LAB_00166616:
    loop = puVar2;
    run_test_random_sync_cold_3();
  }
  run_test_random_sync_cold_5();
LAB_00166620:
  run_test_random_sync_cold_4();
  iVar1 = uv_is_closing((uv_handle_t *)loop);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(random_sync) {
  char zero[256];
  char buf[256];

  ASSERT(UV_EINVAL == uv_random(NULL, NULL, buf, sizeof(buf), -1, NULL));
  ASSERT(UV_E2BIG == uv_random(NULL, NULL, buf, -1, -1, NULL));

  memset(buf, 0, sizeof(buf));
  ASSERT(0 == uv_random(NULL, NULL, buf, sizeof(buf), 0, NULL));

  /* Buy a lottery ticket if you manage to trip this assertion. */
  memset(zero, 0, sizeof(zero));
  ASSERT(0 != memcmp(buf, zero, sizeof(zero)));

  MAKE_VALGRIND_HAPPY();
  return 0;
}